

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
llvm::SmallVectorImpl<unsigned_char>::resize(SmallVectorImpl<unsigned_char> *this,size_type N)

{
  ulong uVar1;
  size_t __n;
  
  uVar1 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                 super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
  if (uVar1 <= N) {
    if (N <= uVar1) {
      return;
    }
    if ((this->super_SmallVectorTemplateBase<unsigned_char,_true>).
        super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity < N) {
      SmallVectorBase::grow_pod((SmallVectorBase *)this,this + 1,N,1);
    }
    uVar1 = (ulong)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                   super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size;
    __n = N - uVar1;
    if (__n != 0) {
      memset((void *)(uVar1 + (long)(this->super_SmallVectorTemplateBase<unsigned_char,_true>).
                                    super_SmallVectorTemplateCommon<unsigned_char,_void>.
                                    super_SmallVectorBase.BeginX),0,__n);
    }
  }
  if (N <= (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
           super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity) {
    (this->super_SmallVectorTemplateBase<unsigned_char,_true>).
    super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = (uint)N;
    return;
  }
  __assert_fail("N <= capacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0x43,"void llvm::SmallVectorBase::set_size(size_t)");
}

Assistant:

void resize(size_type N) {
    if (N < this->size()) {
      this->destroy_range(this->begin()+N, this->end());
      this->set_size(N);
    } else if (N > this->size()) {
      if (this->capacity() < N)
        this->grow(N);
      for (auto I = this->end(), E = this->begin() + N; I != E; ++I)
        new (&*I) T();
      this->set_size(N);
    }
  }